

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_number_toExponential(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  JSValueUnion JVar2;
  ulong uVar3;
  int n_digits;
  uint32_t tag;
  uint uVar4;
  int64_t iVar5;
  JSValueUnion JVar6;
  JSValue val;
  JSValue JVar7;
  JSValue JVar8;
  double d;
  JSValueUnion local_30;
  uint local_24;
  
  JVar7 = js_thisNumberValue(ctx,this_val);
  uVar4 = (uint)JVar7.tag;
  if (uVar4 == 6) {
    JVar2.float64 = -NAN;
    JVar6 = JVar7.u;
LAB_00165fa8:
    iVar5 = JVar7.tag;
    uVar3 = (ulong)JVar7.u.ptr & (ulong)JVar2.ptr;
  }
  else {
    if (uVar4 < 3) {
      JVar6.float64 = (double)JVar7.u._0_4_;
LAB_00165ef0:
      local_30 = JVar6;
      JVar7 = *argv;
      if (0xfffffff4 < (uint)argv->tag) {
        *(int *)(argv->u).ptr = *(argv->u).ptr + 1;
      }
      iVar1 = JS_ToInt32SatFree(ctx,(int *)&local_24,JVar7);
      if (iVar1 == 0) {
        if (((ulong)local_30.ptr & 0x7fffffffffffffff) < 0x7ff0000000000000) {
          if ((int)argv->tag == 3) {
            iVar1 = 4;
            n_digits = 0;
          }
          else {
            if (100 < local_24) {
              JS_ThrowRangeError(ctx,"invalid number of digits");
              goto LAB_00165f1a;
            }
            n_digits = local_24 + 1;
            iVar1 = 5;
          }
          JVar7 = js_dtoa(ctx,local_30.float64,10,n_digits,iVar1);
        }
        else {
          val.tag = 7;
          val.u.float64 = local_30.float64;
          JVar7 = JS_ToStringInternal(ctx,val,0);
        }
        JVar2 = JVar7.u;
        JVar7.tag = JVar7.tag;
        JVar7.u.float64 = -NAN;
        JVar6 = JVar2;
        goto LAB_00165fa8;
      }
    }
    else {
      JVar6 = JVar7.u;
      if ((uVar4 == 7) ||
         (iVar1 = __JS_ToFloat64Free(ctx,&local_30.float64,JVar7), JVar6 = local_30, iVar1 == 0))
      goto LAB_00165ef0;
    }
LAB_00165f1a:
    JVar6.float64 = 0.0;
    iVar5 = 6;
    uVar3 = 0;
  }
  JVar8.u.ptr = (void *)((ulong)JVar6.ptr & 0xffffffff | uVar3);
  JVar8.tag = iVar5;
  return JVar8;
}

Assistant:

static JSValue js_number_toExponential(JSContext *ctx, JSValueConst this_val,
                                       int argc, JSValueConst *argv)
{
    JSValue val;
    int f, flags;
    double d;

    val = js_thisNumberValue(ctx, this_val);
    if (JS_IsException(val))
        return val;
    if (JS_ToFloat64Free(ctx, &d, val))
        return JS_EXCEPTION;
    if (JS_ToInt32Sat(ctx, &f, argv[0]))
        return JS_EXCEPTION;
    if (!isfinite(d)) {
        return JS_ToStringFree(ctx,  __JS_NewFloat64(ctx, d));
    }
    if (JS_IsUndefined(argv[0])) {
        flags = 0;
        f = 0;
    } else {
        if (f < 0 || f > 100)
            return JS_ThrowRangeError(ctx, "invalid number of digits");
        f++;
        flags = JS_DTOA_FIXED_FORMAT;
    }
    return js_dtoa(ctx, d, 10, f, flags | JS_DTOA_FORCE_EXP);
}